

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.c
# Opt level: O1

deUint64 deRandom_getUint64(deRandom *rnd)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = rnd->w;
  uVar1 = rnd->x << 0xb ^ rnd->x;
  uVar1 = uVar1 >> 8 ^ uVar2 >> 0x13 ^ uVar2 ^ uVar1;
  uVar3 = rnd->y << 0xb ^ rnd->y;
  rnd->x = rnd->z;
  rnd->y = uVar2;
  rnd->z = uVar1;
  uVar2 = uVar1 >> 0x13 ^ uVar3 >> 8 ^ uVar3 ^ uVar1;
  rnd->w = uVar2;
  return CONCAT44(uVar1,uVar2);
}

Assistant:

deUint32 deRandom_getUint32 (deRandom* rnd)
{
	deUint32 w = rnd->w;
	deUint32 t;

	t = rnd->x ^ (rnd->x << 11);
	rnd->x = rnd->y;
	rnd->y = rnd->z;
	rnd->z = w;
	rnd->w = w = (w ^ (w >> 19)) ^ (t ^ (t >> 8));
	return w;
}